

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O3

void __thiscall
leveldb::EnvTest_StartThread_Test::~EnvTest_StartThread_Test(EnvTest_StartThread_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(EnvTest, StartThread) {
  State state(0, 3);
  for (int i = 0; i < 3; i++) {
    env_->StartThread(&ThreadBody, &state);
  }

  MutexLock l(&state.mu);
  while (state.num_running != 0) {
    state.cvar.Wait();
  }
  ASSERT_EQ(state.val, 3);
}